

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CircularPriorityQueue.hpp
# Opt level: O1

void __thiscall CircularPriorityQueue<int>::pop(CircularPriorityQueue<int> *this)

{
  Node<int> *this_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  uint uVar4;
  Node<int> *pNVar5;
  void *pvVar6;
  ulong *puVar7;
  ulong *puVar8;
  int extraout_EDX;
  long lVar9;
  int iVar10;
  int in_ESI;
  int *piVar11;
  size_t sVar12;
  ulong uVar13;
  ulong uVar14;
  
  pNVar5 = getPrevPriorNode(this);
  this_00 = pNVar5->next;
  uVar4 = pthread_mutex_lock((pthread_mutex_t *)&this_00->usedMutex);
  if (uVar4 == 0) {
    bVar3 = Node<int>::pop(this_00);
    if ((bVar3) && (pNVar5->next != this_00->next)) {
      pNVar5->next = this_00->next;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this_00->usedMutex);
    return;
  }
  piVar11 = (int *)(ulong)uVar4;
  std::__throw_system_error(uVar4);
  piVar11[2] = 2;
  pvVar6 = operator_new__(4);
  *(void **)(piVar11 + 4) = pvVar6;
  piVar11[0xc] = 0;
  *piVar11 = in_ESI;
  piVar11[1] = extraout_EDX;
  iVar10 = extraout_EDX * in_ESI;
  piVar11[2] = iVar10;
  sVar12 = (long)in_ESI * 8;
  if (in_ESI < 0) {
    sVar12 = 0xffffffffffffffff;
  }
  pvVar6 = operator_new__(sVar12);
  if (in_ESI != 0) {
    memset(pvVar6,0,(long)in_ESI * 8);
  }
  uVar14 = (ulong)iVar10;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar14;
  *(void **)(piVar11 + 10) = pvVar6;
  uVar13 = 0xffffffffffffffff;
  if (SUB168(auVar1 * ZEXT816(0x30),8) == 0) {
    uVar13 = SUB168(auVar1 * ZEXT816(0x30),0) | 8;
  }
  puVar7 = (ulong *)operator_new__(uVar13);
  *puVar7 = uVar14;
  if (iVar10 != 0) {
    puVar8 = puVar7 + 4;
    lVar9 = uVar14 * 0x30;
    do {
      puVar8[-3] = 0;
      puVar8[-2] = 0;
      puVar8[-1] = 0;
      puVar8[1] = (ulong)puVar8;
      *puVar8 = (ulong)puVar8;
      puVar8[2] = 0;
      puVar8 = puVar8 + 6;
      lVar9 = lVar9 + -0x30;
    } while (lVar9 != 0);
  }
  *(ulong **)(piVar11 + 6) = puVar7 + 1;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar14;
  uVar13 = 0xffffffffffffffff;
  if (SUB168(auVar2 * ZEXT816(0x28),8) == 0) {
    uVar13 = SUB168(auVar2 * ZEXT816(0x28),0);
  }
  pvVar6 = operator_new__(uVar13);
  if (iVar10 != 0) {
    memset(pvVar6,0,((uVar14 * 0x28 - 0x28) / 0x28) * 0x28 + 0x28);
  }
  *(void **)(piVar11 + 8) = pvVar6;
  return;
}

Assistant:

void pop() {
        Node<T> *prev = getPrevPriorNode();
        Node<T> *nodeToPop = prev->next;

        nodeToPop->usedMutex.lock();
        bool needToDelete = nodeToPop->pop();
        if (needToDelete && prev->next != nodeToPop->next) {
            prev->next = nodeToPop->next;
        }
        nodeToPop->usedMutex.unlock();
    }